

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

RecyclerWeakReference<const_Js::PropertyRecord> * __thiscall
JsUtil::
List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
::CompactEnd<true>(List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int iVar4;
  WriteBarrierPtr<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_> *pWVar5;
  long lVar6;
  
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  iVar4 = (this->
          super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
          ).count;
  while( true ) {
    if (iVar4 == 0) {
      return (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0;
    }
    pWVar5 = (this->
             super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
             ).buffer.ptr;
    iVar4 = iVar4 + -1;
    lVar6 = (long)iVar4;
    if (pWVar5[lVar6].ptr == (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                         ,0x1bd,"(!weaklyRefItems || (this->buffer[this->count - 1] != nullptr))",
                         "!weaklyRefItems || (this->buffer[this->count - 1] != nullptr)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      pWVar5 = (this->
               super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr;
      iVar4 = (this->
              super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
              ).count + -1;
      lVar6 = (long)iVar4;
    }
    if (((pWVar5[lVar6].ptr)->super_RecyclerWeakReferenceBase).strongRef != (Type)0x0) break;
    (this->
    super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
    ).count = iVar4;
    pWVar5[lVar6].ptr = (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0;
  }
  return pWVar5[lVar6].ptr;
}

Assistant:

T CompactEnd()
        {
            while (this->count != 0)
            {
                AnalysisAssert(!weaklyRefItems || (this->buffer[this->count - 1] != nullptr));
                if (weaklyRefItems ?
                    this->buffer[this->count - 1]->Get() != nullptr :
                    this->buffer[this->count - 1] != nullptr)
                {
                    return this->buffer[this->count - 1];
                }
                this->count--;
                this->buffer[this->count] = nullptr;
            }

            return nullptr;
        }